

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::dark_region(RandomizerWorld *this,WorldRegion *region)

{
  pointer ppWVar1;
  WorldPath *this_00;
  Item *item;
  pointer ppWVar2;
  allocator<char> local_69;
  pointer local_68;
  pointer local_60;
  WorldNode *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_dark_region = region;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            (&(this->super_World)._dark_maps,&region->_dark_map_ids);
  local_68 = (region->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (local_60 = (region->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; local_60 != local_68;
      local_60 = local_60 + 1) {
    local_58 = *local_60;
    ppWVar1 = (local_58->_ingoing_paths).
              super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppWVar2 = (local_58->_ingoing_paths).
                   super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppWVar2 != ppWVar1; ppWVar2 = ppWVar2 + 1) {
      this_00 = *ppWVar2;
      if (this_00->_from_node->_region != region) {
        item = World::item(&this->super_World,'\x1a');
        WorldPath::add_required_item(this_00,item);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"in a very dark place",&local_69);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_58->_hints,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void RandomizerWorld::dark_region(WorldRegion* region)
{
    _dark_region = region;
    this->dark_maps(region->dark_map_ids());

    for(WorldNode* node : region->nodes())
    {
        for (WorldPath* path : node->ingoing_paths())
            if(path->origin()->region() != region)
                path->add_required_item(this->item(ITEM_LANTERN));

        node->add_hint("in a very dark place");
    }
}